

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_comp_unit(SyntaxAnalyze *this)

{
  pointer pWVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  vector<front::word::Word,_std::allocator<front::word::Word>_> *pvVar5;
  
  hp_init_external_function(this);
  irGenerator::irGenerator::ir_begin_of_program(&this->irGenerator);
  sVar3 = this->matched_index;
  lVar4 = (long)(this->word_list->
                super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->word_list->
                super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
                super__Vector_impl_data._M_start;
  do {
    if ((ulong)((lVar4 >> 4) * -0x5555555555555555) <= sVar3 + 1) {
      irGenerator::irGenerator::ir_end_of_program(&this->irGenerator);
      return;
    }
    bVar2 = try_word(this,1,INTTK,VOIDTK);
    sVar3 = this->matched_index;
    pvVar5 = this->word_list;
    if (bVar2) {
      pWVar1 = (pvVar5->super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pvVar5->
                         super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                 -0x5555555555555555) <= sVar3 + 2) goto LAB_0019df27;
      bVar2 = word::Word::match_token(pWVar1 + sVar3 + 2,IDENFR);
      sVar3 = this->matched_index;
      pvVar5 = this->word_list;
      if (!bVar2) goto LAB_0019df27;
      pWVar1 = (pvVar5->super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(pvVar5->
                         super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                 -0x5555555555555555) <= sVar3 + 3) goto LAB_0019df27;
      bVar2 = word::Word::match_token(pWVar1 + sVar3 + 3,LPARENT);
      if (!bVar2) {
        sVar3 = this->matched_index;
        pvVar5 = this->word_list;
        goto LAB_0019df27;
      }
      gm_func_def(this);
    }
    else {
LAB_0019df27:
      pWVar1 = (pvVar5->super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (sVar3 + 1 <
          (ulong)(((long)(pvVar5->
                         super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 4) *
                 -0x5555555555555555)) {
        bVar2 = word::Word::match_token(pWVar1 + sVar3 + 1,CONSTTK);
        if (bVar2) {
          gm_const_decl(this);
          goto LAB_0019df6c;
        }
      }
      gm_var_decl(this);
    }
LAB_0019df6c:
    sVar3 = this->matched_index;
    lVar4 = (long)(this->word_list->
                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)(this->word_list->
                  super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl
                  .super__Vector_impl_data._M_start;
  } while( true );
}

Assistant:

void SyntaxAnalyze::gm_comp_unit() {
  hp_init_external_function();

  irGenerator.ir_begin_of_program();

  while (matched_index + 1 < word_list.size()) {
    if (try_word(1, Token::INTTK, Token::VOIDTK) &&
        try_word(2, Token::IDENFR) && try_word(3, Token::LPARENT)) {
      gm_func_def();
    } else if (try_word(1, Token::CONSTTK)) {
      gm_const_decl();
    } else {
      gm_var_decl();
    }
  }

  irGenerator.ir_end_of_program();
}